

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O0

void trace_init_(long *n)

{
  Boolean BVar1;
  unsigned_long *in_RDI;
  long err;
  MA_AccessIndex index;
  MA_AccessIndex *index_00;
  Integer *in_stack_fffffffffffffff0;
  
  if ((long)*in_RDI < 1) {
    printf("trace_init>>  invalid max number of events: %ld\n",*in_RDI);
  }
  else {
    current = 0;
    index_00 = (MA_AccessIndex *)0x0;
    MAX_EVENTS = *in_RDI;
    BVar1 = MA_push_get(index,err,(char *)in_RDI,in_stack_fffffffffffffff0,(MA_AccessIndex *)0x0);
    if (BVar1 == 0) {
      printf("trace_init>> failed to allocate memory 1\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    MA_get_pointer((Integer)in_RDI,in_stack_fffffffffffffff0);
    if (tlog == (Integer *)0x0) {
      printf("trace_init>> null pointer: 1\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    BVar1 = MA_push_get(index,err,(char *)in_RDI,in_stack_fffffffffffffff0,index_00);
    if (BVar1 == 0) {
      printf("trace_init>> failed to allocate memory 2\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    MA_get_pointer((Integer)in_RDI,in_stack_fffffffffffffff0);
    if (indlog == (Integer *)0x0) {
      printf("trace_init>> null pointer: 2\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    BVar1 = MA_push_get(index,err,(char *)in_RDI,in_stack_fffffffffffffff0,index_00);
    if (BVar1 == 0) {
      printf("trace_init>> failed to allocate memory 2\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    MA_get_pointer((Integer)in_RDI,in_stack_fffffffffffffff0);
    if (galog == (int *)0x0) {
      printf("trace_init>> null pointer: 2\n");
      index_00 = (MA_AccessIndex *)((long)index_00 + 1);
    }
    ganum = 0;
    if (index_00 != (MA_AccessIndex *)0x0) {
      MAX_EVENTS = 0;
    }
  }
  return;
}

Assistant:

void trace_init_(long *n)
{
    MA_AccessIndex index;
    long err;
    
    if(*n<=0){
        printf("trace_init>>  invalid max number of events: %ld\n",*n);
        return;
    }
    
    current = 0;
    err = 0;
    
    /*  MA_initialize(MT_INT,10000,10000); */ 
    
    MAX_EVENTS = *n;

    if(!MA_push_get(MT_LONGINT, *n*2, "timeLog", &thandle, &index)){
        printf("trace_init>> failed to allocate memory 1\n");
        err ++;
    }
    MA_get_pointer(thandle, &tlog);
    if(!tlog){
        printf("trace_init>> null pointer: 1\n");
        err ++;
    }

    if(!MA_push_get(MT_LONGINT, *n*6, "indexLog", &ihandle, &index)){
        printf("trace_init>> failed to allocate memory 2\n");
        err ++;
    }
    MA_get_pointer(ihandle, &indlog);
    if(!indlog) { 
        printf("trace_init>> null pointer: 2\n");
        err ++;
    }

    if(!MA_push_get(MT_INT, MAX_GAS, "gaLog", &gahandle, &index)){
        printf("trace_init>> failed to allocate memory 2\n");
        err ++;
    }
    MA_get_pointer(gahandle, &galog);
    if(!galog) { 
        printf("trace_init>> null pointer: 2\n");
        err ++;
    }
    
    ganum = 0;
    
    if(err) MAX_EVENTS = 0;
}